

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O3

bool operator==(Vehicle *a,Vehicle *b)

{
  pointer pcVar1;
  Person *a_00;
  Person *b_00;
  bool bVar2;
  int iVar3;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  if ((a->type == b->type) && (a->_age == b->_age)) {
    pcVar1 = (a->_name)._M_dataplus._M_p;
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + (a->_name)._M_string_length);
    pcVar1 = (b->_name)._M_dataplus._M_p;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + (b->_name)._M_string_length);
    if ((local_58 == local_38) &&
       ((local_58 == 0 || (iVar3 = bcmp(local_60,local_40,local_58), iVar3 == 0)))) {
      a_00 = (a->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
             super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
             super__Head_base<0UL,_Person_*,_false>._M_head_impl;
      b_00 = (b->_owner)._M_t.super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
             super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
             super__Head_base<0UL,_Person_*,_false>._M_head_impl;
      if (b_00 == (Person *)0x0 || a_00 == (Person *)0x0) {
        bVar2 = a_00 == (Person *)0x0 && b_00 == (Person *)0x0;
      }
      else {
        bVar2 = operator==(a_00,b_00);
      }
    }
    else {
      bVar2 = false;
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool operator==(const Vehicle& a, const Vehicle& b)
  {
    return a.type == b.type
      &&   a.age() == b.age()
      &&   a.name() == b.name()
      &&   pointee_equal(a.owner().get(), b.owner().get());
  }